

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

size_t uv__write_req_size(uv_write_t *req)

{
  size_t sVar1;
  size_t size;
  uv_write_t *req_local;
  
  if (req->bufs == (uv_buf_t *)0x0) {
    __assert_fail("req->bufs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/stream.c"
                  ,0x2a1,"size_t uv__write_req_size(uv_write_t *)");
  }
  sVar1 = uv__count_bufs(req->bufs + req->write_index,req->nbufs - req->write_index);
  if (sVar1 <= req->handle->write_queue_size) {
    return sVar1;
  }
  __assert_fail("req->handle->write_queue_size >= size",
                "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/stream.c"
                ,0x2a4,"size_t uv__write_req_size(uv_write_t *)");
}

Assistant:

static size_t uv__write_req_size(uv_write_t* req) {
  size_t size;

  assert(req->bufs != NULL);
  size = uv__count_bufs(req->bufs + req->write_index,
                        req->nbufs - req->write_index);
  assert(req->handle->write_queue_size >= size);

  return size;
}